

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManPrintBoxInfo(Au_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Au_Man_t *pAVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Au_Ntk_t *p_01;
  Au_Obj_t *p_02;
  Au_Ntk_t *pAVar3;
  undefined8 *puVar4;
  ulong uVar5;
  int iVar6;
  int i;
  ulong uVar7;
  int iVar8;
  int local_38;
  
  pAVar1 = pNtk->pMan;
  if (pAVar1 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    return;
  }
  local_38 = (pAVar1->vNtks).nSize;
  p_00 = Vec_IntAlloc(local_38);
  p_00->nSize = local_38;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)local_38 << 2);
  }
  p = &pAVar1->vNtks;
  iVar8 = 1;
  do {
    if ((pAVar1->vNtks).nSize <= iVar8) {
      Vec_IntFree(p_00);
      for (iVar8 = 1; iVar8 < (pAVar1->vNtks).nSize; iVar8 = iVar8 + 1) {
        puVar4 = (undefined8 *)Vec_PtrEntry(p,iVar8);
        if (*(int *)(puVar4 + 0xc) == 0) {
          printf("MODULE  ");
          printf("%-30s : ",*puVar4);
          printf("PI=%6d ",(ulong)*(uint *)(puVar4 + 10));
          printf("PO=%6d ",(ulong)*(uint *)((long)puVar4 + 0x54));
          printf("BB=%6d ",(ulong)*(uint *)(puVar4 + 0xc));
          printf("ND=%6d ",(ulong)*(uint *)((long)puVar4 + 100));
          putchar(10);
        }
      }
      return;
    }
    p_01 = (Au_Ntk_t *)Vec_PtrEntry(p,iVar8);
    if (p_01->nObjs[6] != 0) {
      Vec_IntFill(p_00,local_38,0);
      for (iVar6 = 0; iVar6 < (p_01->vObjs).nSize; iVar6 = iVar6 + 1) {
        p_02 = Au_NtkObjI(p_01,iVar6);
        if ((((undefined1  [16])*p_02 & (undefined1  [16])0x700000000) ==
             (undefined1  [16])0x600000000) &&
           (pAVar3 = Au_ObjModel(p_02), pAVar3 != p_01 && pAVar3 != (Au_Ntk_t *)0x0)) {
          uVar2 = (pAVar1->vNtks).nSize;
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          uVar5 = 0;
          while( true ) {
            if (uVar7 == uVar5) goto LAB_006ac08f;
            if ((Au_Ntk_t *)(pAVar1->vNtks).pArray[uVar5] == pAVar3) break;
            uVar5 = uVar5 + 1;
          }
          if ((int)uVar2 <= (int)uVar5) {
LAB_006ac08f:
            __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                          ,0x24c,"void Au_ManPrintBoxInfo(Au_Ntk_t *)");
          }
          if (p_00->nSize <= (int)uVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          p_00->pArray[uVar5] = p_00->pArray[uVar5] + 1;
        }
      }
      i = 0;
      printf("MODULE  ");
      printf("%-30s : ",p_01->pName);
      printf("PI=%6d ",(ulong)(uint)p_01->nObjs[2]);
      printf("PO=%6d ",(ulong)(uint)p_01->nObjs[3]);
      printf("BB=%6d ",(ulong)(uint)p_01->nObjs[6]);
      printf("ND=%6d ",(ulong)(uint)p_01->nObjs[7]);
      putchar(10);
      local_38 = p_00->nSize;
      iVar6 = 0;
      if (0 < local_38) {
        iVar6 = local_38;
      }
      for (; iVar6 != i; i = i + 1) {
        uVar2 = Vec_IntEntry(p_00,i);
        if (uVar2 != 0) {
          puVar4 = (undefined8 *)Vec_PtrEntry(p,i);
          printf("%15d : %s\n",(ulong)uVar2,*puVar4);
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Au_ManPrintBoxInfo( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel, * pBoxModel;
    Au_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

/*
    vMods->nSize--;
    vMods->pArray++;
    // sort models by name
    Vec_PtrSort( vMods, (int(*)())Au_NtkCompareNames );
    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Au_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Au_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );
    vMods->pArray--;
    vMods->nSize++;
*/

//    Vec_PtrForEachEntry( Au_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Au_NtkName(pModel) );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Au_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = Au_ObjModel(pObj);
            if ( pBoxModel == NULL || pBoxModel == pModel )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Au_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) ); // sans constants
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Au_NtkName((Au_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );
    }
}